

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O0

boolean mon_reflects(monst *mon,char *str)

{
  boolean bVar1;
  obj *poVar2;
  char *pcVar3;
  obj *orefl;
  char *str_local;
  monst *mon_local;
  
  poVar2 = which_armor(mon,8);
  if ((poVar2 == (obj *)0x0) || ((poVar2->otyp != 0x8e && ((poVar2->oprops & 0x10U) == 0)))) {
    poVar2 = mon->mw;
    if ((poVar2 == (obj *)0x0) ||
       ((bVar1 = arti_reflects(poVar2), bVar1 == '\0' && ((poVar2->oprops & 0x10U) == 0)))) {
      poVar2 = which_armor(mon,0x10000);
      if ((poVar2 == (obj *)0x0) || ((poVar2->otyp != 0xd0 && ((poVar2->oprops & 0x10U) == 0)))) {
        poVar2 = which_armor(mon,2);
        if ((poVar2 == (obj *)0x0) || ((poVar2->oprops & 0x10U) == 0)) {
          poVar2 = which_armor(mon,1);
          if ((poVar2 == (obj *)0x0) ||
             ((((poVar2->otyp != 0x60 && (poVar2->otyp != 0x55)) && (poVar2->otyp != 0x69)) &&
              ((poVar2->otyp != 0x5e && ((poVar2->oprops & 0x10U) == 0)))))) {
            poVar2 = which_armor(mon,0x40);
            if ((poVar2 == (obj *)0x0) || ((poVar2->oprops & 0x10U) == 0)) {
              if (((mon->data == mons + 0x94) || (mon->data == mons + 0x9d)) ||
                 (mon->data == mons + 0x179)) {
                if (str != (char *)0x0) {
                  pcVar3 = mon_nam(mon);
                  pcVar3 = s_suffix(pcVar3);
                  pline(str,pcVar3,"scales");
                }
                mon_local._7_1_ = '\x01';
              }
              else {
                mon_local._7_1_ = '\0';
              }
            }
            else {
              if (str != (char *)0x0) {
                pcVar3 = mon_nam(mon);
                pcVar3 = s_suffix(pcVar3);
                pline(str,pcVar3,"shirt");
                if ((poVar2->oprops & 0x10U) != 0) {
                  poVar2->oprops_known = poVar2->oprops_known | 0x10;
                }
              }
              mon_local._7_1_ = '\x01';
            }
          }
          else {
            if (str != (char *)0x0) {
              pcVar3 = mon_nam(mon);
              pcVar3 = s_suffix(pcVar3);
              pline(str,pcVar3,"armor");
              if ((poVar2->oprops & 0x10U) == 0) {
                if ((poVar2->otyp == 0x60) || (poVar2->otyp == 0x55)) {
                  discover_object((int)poVar2->otyp,'\x01','\x01');
                }
              }
              else {
                poVar2->oprops_known = poVar2->oprops_known | 0x10;
              }
            }
            mon_local._7_1_ = '\x01';
          }
        }
        else {
          if (str != (char *)0x0) {
            pcVar3 = mon_nam(mon);
            pcVar3 = s_suffix(pcVar3);
            pline(str,pcVar3,"cloak");
            if ((poVar2->oprops & 0x10U) != 0) {
              poVar2->oprops_known = poVar2->oprops_known | 0x10;
            }
          }
          mon_local._7_1_ = '\x01';
        }
      }
      else {
        if (str != (char *)0x0) {
          pcVar3 = mon_nam(mon);
          pcVar3 = s_suffix(pcVar3);
          pline(str,pcVar3,"amulet");
          if (poVar2->otyp == 0xd0) {
            discover_object(0xd0,'\x01','\x01');
          }
          if ((poVar2->oprops & 0x10U) != 0) {
            poVar2->oprops_known = poVar2->oprops_known | 0x10;
          }
        }
        mon_local._7_1_ = '\x01';
      }
    }
    else {
      if (str != (char *)0x0) {
        pcVar3 = mon_nam(mon);
        pcVar3 = s_suffix(pcVar3);
        pline(str,pcVar3,"weapon");
        if ((poVar2->oprops & 0x10U) != 0) {
          poVar2->oprops_known = poVar2->oprops_known | 0x10;
        }
      }
      mon_local._7_1_ = '\x01';
    }
  }
  else {
    if (str != (char *)0x0) {
      pcVar3 = mon_nam(mon);
      pcVar3 = s_suffix(pcVar3);
      pline(str,pcVar3,"shield");
      if (poVar2->otyp == 0x8e) {
        discover_object(0x8e,'\x01','\x01');
      }
      if ((poVar2->oprops & 0x10U) != 0) {
        poVar2->oprops_known = poVar2->oprops_known | 0x10;
      }
    }
    mon_local._7_1_ = '\x01';
  }
  return mon_local._7_1_;
}

Assistant:

boolean mon_reflects(struct monst *mon, const char *str)
{
	struct obj *orefl = which_armor(mon, W_ARMS);

	if (orefl && (orefl->otyp == SHIELD_OF_REFLECTION ||
		      (orefl->oprops & ITEM_REFLECTION))) {
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "shield");
		if (orefl->otyp == SHIELD_OF_REFLECTION)
		    makeknown(SHIELD_OF_REFLECTION);
		if (orefl->oprops & ITEM_REFLECTION)
		    orefl->oprops_known |= ITEM_REFLECTION;
	    }
	    return TRUE;

	} else if ((orefl = MON_WEP(mon)) &&
		   (arti_reflects(orefl) ||
		    (orefl->oprops & ITEM_REFLECTION))) {
	    /* due to wielded artifact weapon */
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "weapon");
		if (orefl->oprops & ITEM_REFLECTION)
		    orefl->oprops_known |= ITEM_REFLECTION;
	    }
	    return TRUE;

	} else if ((orefl = which_armor(mon, W_AMUL)) &&
		   (orefl->otyp == AMULET_OF_REFLECTION ||
		    (orefl->oprops & ITEM_REFLECTION))) {
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "amulet");
		if (orefl->otyp == AMULET_OF_REFLECTION)
		    makeknown(AMULET_OF_REFLECTION);
		if (orefl->oprops & ITEM_REFLECTION)
		    orefl->oprops_known |= ITEM_REFLECTION;
	    }
	    return TRUE;

	} else if ((orefl = which_armor(mon, W_ARMC)) &&
		   (orefl->oprops & ITEM_REFLECTION)) {
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "cloak");
		if (orefl->oprops & ITEM_REFLECTION)
		    orefl->oprops_known |= ITEM_REFLECTION;
	    }
	    return TRUE;

	} else if ((orefl = which_armor(mon, W_ARM)) &&
		   (orefl->otyp == SILVER_DRAGON_SCALES ||
		    orefl->otyp == SILVER_DRAGON_SCALE_MAIL ||
		    orefl->otyp == CHROMATIC_DRAGON_SCALES ||
		    orefl->otyp == CHROMATIC_DRAGON_SCALE_MAIL ||
		    (orefl->oprops & ITEM_REFLECTION))) {
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "armor");
		if (orefl->oprops & ITEM_REFLECTION) {
		    orefl->oprops_known |= ITEM_REFLECTION;
		} else if (orefl->otyp == SILVER_DRAGON_SCALES ||
			   orefl->otyp == SILVER_DRAGON_SCALE_MAIL) {
		    makeknown(orefl->otyp);
		}
	    }
	    return TRUE;

	} else if ((orefl = which_armor(mon, W_ARMU)) &&
		   (orefl->oprops & ITEM_REFLECTION)) {
	    if (str) {
		pline(str, s_suffix(mon_nam(mon)), "shirt");
		if (orefl->oprops & ITEM_REFLECTION)
		    orefl->oprops_known |= ITEM_REFLECTION;
	    }
	    return TRUE;

	} else if (mon->data == &mons[PM_SILVER_DRAGON] ||
		   mon->data == &mons[PM_CHROMATIC_DRAGON] ||
		   mon->data == &mons[PM_TIAMAT]) {
	    /* Silver dragons only reflect when mature; babies do not */
	    if (str)
		pline(str, s_suffix(mon_nam(mon)), "scales");
	    return TRUE;
	}

	return FALSE;
}